

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::UdpPortDeclSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  local_1 = kind == UdpInputPortDecl || kind == UdpOutputPortDecl;
  return local_1;
}

Assistant:

bool UdpPortDeclSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UdpInputPortDecl:
        case SyntaxKind::UdpOutputPortDecl:
            return true;
        default:
            return false;
    }
}